

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

Point * __thiscall
MeshLib::Point::rotate(Point *__return_storage_ptr__,Point *this,double theta,Point *vector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  Point local_70;
  Point local_58;
  double local_40;
  double sin_t;
  double cos_t;
  Point *local_28;
  Point *vector_local;
  double theta_local;
  Point *this_local;
  Point *result;
  
  cos_t._7_1_ = 0;
  local_28 = vector;
  vector_local = (Point *)theta;
  theta_local = (double)this;
  this_local = __return_storage_ptr__;
  Point(__return_storage_ptr__);
  sin_t = cos((double)vector_local);
  local_40 = sin((double)vector_local);
  dVar1 = this->v[0];
  pdVar6 = operator[](vector,0);
  dVar2 = *pdVar6;
  dVar3 = this->v[1];
  pdVar6 = operator[](vector,1);
  dVar4 = *pdVar6;
  dVar5 = this->v[2];
  pdVar6 = operator[](vector,2);
  operator*(&local_70,vector,dVar5 * *pdVar6 + dVar1 * dVar2 + dVar3 * dVar4);
  operator*(&local_58,&local_70,1.0 - sin_t);
  __return_storage_ptr__->v[2] = local_58.v[2];
  __return_storage_ptr__->v[0] = local_58.v[0];
  __return_storage_ptr__->v[1] = local_58.v[1];
  ~Point(&local_58);
  ~Point(&local_70);
  dVar2 = sin_t;
  dVar1 = this->v[0];
  pdVar6 = operator[](__return_storage_ptr__,0);
  dVar3 = sin_t;
  *pdVar6 = dVar1 * dVar2 + *pdVar6;
  dVar1 = this->v[1];
  pdVar6 = operator[](__return_storage_ptr__,1);
  dVar2 = sin_t;
  *pdVar6 = dVar1 * dVar3 + *pdVar6;
  dVar1 = this->v[2];
  pdVar6 = operator[](__return_storage_ptr__,2);
  *pdVar6 = dVar1 * dVar2 + *pdVar6;
  dVar1 = this->v[1];
  pdVar6 = operator[](vector,2);
  dVar2 = *pdVar6;
  dVar3 = this->v[2];
  pdVar6 = operator[](vector,1);
  dVar5 = local_40;
  dVar4 = *pdVar6;
  pdVar6 = operator[](__return_storage_ptr__,0);
  *pdVar6 = (dVar1 * dVar2 - dVar3 * dVar4) * dVar5 + *pdVar6;
  dVar1 = this->v[2];
  pdVar6 = operator[](vector,0);
  dVar2 = *pdVar6;
  dVar3 = this->v[0];
  pdVar6 = operator[](vector,2);
  dVar5 = local_40;
  dVar4 = *pdVar6;
  pdVar6 = operator[](__return_storage_ptr__,1);
  *pdVar6 = (dVar1 * dVar2 - dVar3 * dVar4) * dVar5 + *pdVar6;
  dVar1 = this->v[0];
  pdVar6 = operator[](vector,1);
  dVar2 = *pdVar6;
  dVar3 = this->v[1];
  pdVar6 = operator[](vector,0);
  dVar5 = local_40;
  dVar4 = *pdVar6;
  pdVar6 = operator[](__return_storage_ptr__,2);
  *pdVar6 = (dVar1 * dVar2 - dVar3 * dVar4) * dVar5 + *pdVar6;
  return __return_storage_ptr__;
}

Assistant:

Point Point::rotate(double theta, Point vector)
{
	Point result;
	double cos_t = cos(theta);
	double sin_t = sin(theta);
	result = vector * (v[0] * vector[0] + v[1] * vector[1] + v[2] * vector[2]) * (1-cos_t);
	result[0] += v[0] * cos_t;
	result[1] += v[1] * cos_t;
	result[2] += v[2] * cos_t;
	result[0] += (v[1] * vector[2] - v[2] * vector[1]) * sin_t;
	result[1] += (v[2] * vector[0] - v[0] * vector[2]) * sin_t;
	result[2] += (v[0] * vector[1] - v[1] * vector[0]) * sin_t;
	return result;

}